

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getfilecontents.c
# Opt level: O0

econf_err read_file_with_callback
                    (econf_file **key_file,char *file_name,char *delim,char *comment,
                    _func__Bool_char_ptr_void_ptr *callback,void *callback_data)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *__file;
  char *absolute_path;
  int dir_stat;
  char *cdirc;
  stat sb_dir;
  stat sb;
  econf_err t_err;
  void *callback_data_local;
  _func__Bool_char_ptr_void_ptr *callback_local;
  char *comment_local;
  char *delim_local;
  char *file_name_local;
  econf_file **key_file_local;
  
  if ((((key_file == (econf_file **)0x0) || (file_name == (char *)0x0)) || (delim == (char *)0x0))
     || (comment == (char *)0x0)) {
    key_file_local._4_4_ = ECONF_ERROR;
  }
  else {
    iVar2 = lstat(file_name,(stat *)(sb_dir.__glibc_reserved + 2));
    if (iVar2 == -1) {
      key_file_local._4_4_ = ECONF_NOFILE;
    }
    else if (((allow_follow_symlinks & 1U) == 0) && (((uint)sb.st_nlink & 0xf000) == 0xa000)) {
      key_file_local._4_4_ = ECONF_ERROR_FILE_IS_SYM_LINK;
    }
    else if (((file_owner_set & 1U) == 0) || (sb.st_nlink._4_4_ == file_owner)) {
      if (((file_group_set & 1U) == 0) || (sb.st_mode == file_group)) {
        if ((file_permissions_set & 1U) != 0) {
          if (((uint)sb.st_nlink & file_perms_file) == 0) {
            return ECONF_WRONG_FILE_PERMISSION;
          }
          pcVar3 = strdup(file_name);
          __file = dirname(pcVar3);
          iVar2 = lstat(__file,(stat *)&cdirc);
          free(pcVar3);
          if (iVar2 == -1) {
            return ECONF_NOFILE;
          }
          if (((uint)sb_dir.st_nlink & file_perms_dir) == 0) {
            return ECONF_WRONG_DIR_PERMISSION;
          }
        }
        if ((callback == (_func__Bool_char_ptr_void_ptr *)0x0) ||
           (_Var1 = (*callback)(file_name,callback_data), _Var1)) {
          pcVar3 = get_absolute_path(file_name,(econf_err *)((long)sb.__glibc_reserved + 0x14));
          if (pcVar3 == (char *)0x0) {
            key_file_local._4_4_ = sb.__glibc_reserved[2]._4_4_;
          }
          else {
            if (*comment == '\0') {
              (*key_file)->comment = '#';
              callback_local = (_func__Bool_char_ptr_void_ptr *)anon_var_dwarf_1904;
            }
            else {
              (*key_file)->comment = *comment;
              callback_local = (_func__Bool_char_ptr_void_ptr *)comment;
            }
            sb.__glibc_reserved[2]._4_4_ = read_file(*key_file,pcVar3,delim,(char *)callback_local);
            free(pcVar3);
            if (sb.__glibc_reserved[2]._4_4_ == ECONF_SUCCESS) {
              key_file_local._4_4_ = ECONF_SUCCESS;
            }
            else {
              econf_freeFile(*key_file);
              *key_file = (econf_file *)0x0;
              key_file_local._4_4_ = sb.__glibc_reserved[2]._4_4_;
            }
          }
        }
        else {
          key_file_local._4_4_ = ECONF_PARSING_CALLBACK_FAILED;
        }
      }
      else {
        key_file_local._4_4_ = ECONF_WRONG_GROUP;
      }
    }
    else {
      key_file_local._4_4_ = ECONF_WRONG_OWNER;
    }
  }
  return key_file_local._4_4_;
}

Assistant:

econf_err
read_file_with_callback(econf_file **key_file, const char *file_name,
			const char *delim, const char *comment,
			bool (*callback)(const char *filename, const void *data),
			const void *callback_data)
{
  econf_err t_err;
  struct stat sb;

  if (key_file == NULL || file_name == NULL || delim == NULL || comment == NULL)
    return ECONF_ERROR;

  // Checking file permissions, uid, group,...
  if (lstat(file_name, &sb) == -1)
    return ECONF_NOFILE;
  if (!allow_follow_symlinks && (sb.st_mode&S_IFMT) == S_IFLNK)
    return ECONF_ERROR_FILE_IS_SYM_LINK;
  if (file_owner_set && sb.st_uid != file_owner)
    return ECONF_WRONG_OWNER;
  if (file_group_set && sb.st_gid != file_group)
    return ECONF_WRONG_GROUP;
  if (file_permissions_set) {
    struct stat sb_dir;
    if (!(sb.st_mode&file_perms_file))
      return ECONF_WRONG_FILE_PERMISSION;
    char *cdirc = strdup(file_name);
    int dir_stat = lstat(dirname(cdirc), &sb_dir);
    free(cdirc);
    if ( dir_stat == -1)
      return ECONF_NOFILE;
    if (!(sb_dir.st_mode&file_perms_dir))
      return ECONF_WRONG_DIR_PERMISSION;
  }

  // calling user defined checks
  if (callback != NULL && !(*callback)(file_name, callback_data))
    return ECONF_PARSING_CALLBACK_FAILED;

  // Get absolute path if not provided
  char *absolute_path = get_absolute_path(file_name, &t_err);
  if (absolute_path == NULL)
    return t_err;

  if (*comment)
    (*key_file)->comment = comment[0];
  else {
    (*key_file)->comment = '#';
    comment = "#";
  }

  t_err = read_file(*key_file, absolute_path, delim, comment);

  free (absolute_path);

  if(t_err) {
    econf_free(*key_file);
    *key_file = NULL;
    return t_err;
  }

  return ECONF_SUCCESS;
}